

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraIndVer.c
# Opt level: O1

int Fra_InvariantVerify(Aig_Man_t *pAig,int nFrames,Vec_Int_t *vClauses,Vec_Int_t *vLits)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  Cnf_Dat_t *p;
  sat_solver *psVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  timespec ts;
  uint local_68;
  uint local_60;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (nFrames == 1) {
    p = Cnf_DeriveSimple(pAig,pAig->nObjs[3]);
    psVar5 = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,1);
    if (vClauses->nSize < 1) {
      local_68 = 0;
    }
    else {
      piVar2 = vLits->pArray;
      lVar10 = 0;
      local_68 = 0;
      iVar3 = 0;
      do {
        iVar8 = vClauses->pArray[lVar10];
        lVar9 = (long)iVar8;
        if (iVar3 < iVar8) {
          lVar6 = (long)iVar3;
          do {
            *(byte *)(piVar2 + lVar6) = *(byte *)(piVar2 + lVar6) ^ 1;
            lVar6 = lVar6 + 1;
          } while (lVar9 != lVar6);
        }
        lVar6 = (long)iVar3;
        iVar4 = sat_solver_solve(psVar5,piVar2 + lVar6,piVar2 + lVar9,0,0,0,0);
        if (iVar3 < iVar8) {
          do {
            *(byte *)(piVar2 + lVar6) = *(byte *)(piVar2 + lVar6) ^ 1;
            lVar6 = lVar6 + 1;
          } while (lVar9 != lVar6);
        }
        local_68 = local_68 + (iVar4 != -1);
        lVar10 = lVar10 + 1;
        iVar3 = iVar8;
      } while (lVar10 < vClauses->nSize);
    }
    sat_solver_delete(psVar5);
    psVar5 = (sat_solver *)Cnf_DataWriteIntoSolver(p,2,0);
    if (psVar5->size != p->nVars * 2) {
      __assert_fail("pSat->size == 2 * pCnf->nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraIndVer.c"
                    ,100,"int Fra_InvariantVerify(Aig_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
    }
    if (0 < vClauses->nSize) {
      piVar2 = vLits->pArray;
      lVar10 = 0;
      iVar3 = 0;
      do {
        iVar8 = vClauses->pArray[lVar10];
        iVar3 = sat_solver_addclause(psVar5,piVar2 + iVar3,piVar2 + iVar8);
        if (iVar3 == 0) {
          Cnf_DataFree(p);
          sat_solver_delete(psVar5);
          puts("Invariant verification: SAT solver is unsat after adding a clause.");
          return 0;
        }
        lVar10 = lVar10 + 1;
        iVar3 = iVar8;
      } while (lVar10 < vClauses->nSize);
    }
    if (psVar5->qtail != psVar5->qhead) {
      iVar3 = sat_solver_simplify(psVar5);
      if (iVar3 == 0) {
        __assert_fail("RetValue != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraIndVer.c"
                      ,0x78,"int Fra_InvariantVerify(Aig_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
      }
      if (psVar5->qtail != psVar5->qhead) {
        __assert_fail("pSat->qtail == pSat->qhead",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraIndVer.c"
                      ,0x79,"int Fra_InvariantVerify(Aig_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
      }
    }
    if (vClauses->nSize < 1) {
      local_60 = 0;
    }
    else {
      piVar2 = vLits->pArray;
      lVar10 = 0;
      local_60 = 0;
      iVar3 = 0;
      do {
        iVar8 = vClauses->pArray[lVar10];
        lVar9 = (long)iVar8;
        if (iVar3 < iVar8) {
          lVar6 = (long)iVar3;
          do {
            piVar2[lVar6] = p->nVars * 2 + piVar2[lVar6] ^ 1;
            lVar6 = lVar6 + 1;
          } while (lVar9 != lVar6);
        }
        lVar6 = (long)iVar3;
        iVar4 = sat_solver_solve(psVar5,piVar2 + lVar6,piVar2 + lVar9,0,0,0,0);
        if (iVar3 < iVar8) {
          do {
            uVar1 = piVar2[lVar6];
            piVar2[lVar6] = uVar1 ^ 1;
            piVar2[lVar6] = (uVar1 ^ 1) + p->nVars * -2;
            lVar6 = lVar6 + 1;
          } while (lVar9 != lVar6);
        }
        local_60 = local_60 + (iVar4 != -1);
        lVar10 = lVar10 + 1;
        iVar3 = iVar8;
      } while (lVar10 < vClauses->nSize);
    }
    sat_solver_delete(psVar5);
    Cnf_DataFree(p);
    if (local_68 != 0) {
      printf("Invariant verification: %d clauses (out of %d) FAILED the base case.\n",
             (ulong)local_68,(ulong)(uint)vClauses->nSize);
    }
    if (local_60 != 0) {
      printf("Invariant verification: %d clauses (out of %d) FAILED the inductive case.\n",
             (ulong)local_60,(ulong)(uint)vClauses->nSize);
    }
    if (local_60 != 0 || local_68 != 0) {
      return 0;
    }
    iVar3 = 0x962470;
    printf("Invariant verification: %d clauses verified correctly.  ",(ulong)(uint)vClauses->nSize);
    Abc_Print(iVar3,"%s =","Time");
    iVar8 = 3;
    iVar3 = clock_gettime(3,&local_40);
    if (iVar3 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar10 + lVar7) / 1000000.0);
  }
  else {
    puts("Invariant verification: Can only verify for K = 1");
  }
  return 1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Verifies the inductive invariant.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Fra_InvariantVerify( Aig_Man_t * pAig, int nFrames, Vec_Int_t * vClauses, Vec_Int_t * vLits )
{
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    int * pStart;
    int RetValue, Beg, End, i, k;
    int CounterBase = 0, CounterInd = 0;
    abctime clk = Abc_Clock();

    if ( nFrames != 1 )
    {
        printf( "Invariant verification: Can only verify for K = 1\n" );
        return 1;
    }

    // derive CNF
    pCnf = Cnf_DeriveSimple( pAig, Aig_ManCoNum(pAig) );
/*
    // add the property
    {
        Aig_Obj_t * pObj;
        int Lits[1];

        pObj = Aig_ManCo( pAig, 0 );
        Lits[0] = toLitCond( pCnf->pVarNums[pObj->Id], 1 ); 

        Vec_IntPush( vLits, Lits[0] );
        Vec_IntPush( vClauses, Vec_IntSize(vLits) );
        printf( "Added the target property to the set of clauses to be inductively checked.\n" );
    }
*/
    // derive initialized frames for the base case
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, nFrames, 1 );
    // check clauses in the base case
    Beg = 0;
    pStart = Vec_IntArray( vLits );
    Vec_IntForEachEntry( vClauses, End, i )
    {
        // complement the literals
        for ( k = Beg; k < End; k++ )
            pStart[k] = lit_neg(pStart[k]);
        RetValue = sat_solver_solve( pSat, pStart + Beg, pStart + End, 0, 0, 0, 0 );
        for ( k = Beg; k < End; k++ )
            pStart[k] = lit_neg(pStart[k]);
        Beg = End;
        if ( RetValue == l_False )
            continue;
//        printf( "Clause %d failed the base case.\n", i );
        CounterBase++;
    }
    sat_solver_delete( pSat );

    // derive initialized frames for the base case
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, nFrames + 1, 0 );
    assert( pSat->size == 2 * pCnf->nVars );
    // add clauses to the first frame
    Beg = 0;
    pStart = Vec_IntArray( vLits );
    Vec_IntForEachEntry( vClauses, End, i )
    {
        RetValue = sat_solver_addclause( pSat, pStart + Beg, pStart + End );
        Beg = End;
        if ( RetValue == 0 )
        {
            Cnf_DataFree( pCnf );
            sat_solver_delete( pSat );
            printf( "Invariant verification: SAT solver is unsat after adding a clause.\n" );
            return 0;
        }
    }
    // simplify the solver
    if ( pSat->qtail != pSat->qhead )
    {
        RetValue = sat_solver_simplify(pSat);
        assert( RetValue != 0 );
        assert( pSat->qtail == pSat->qhead );
    }

    // check clauses in the base case
    Beg = 0;
    pStart = Vec_IntArray( vLits );
    Vec_IntForEachEntry( vClauses, End, i )
    {
        // complement the literals
        for ( k = Beg; k < End; k++ )
        {
            pStart[k] += 2 * pCnf->nVars;
            pStart[k] = lit_neg(pStart[k]);
        }
        RetValue = sat_solver_solve( pSat, pStart + Beg, pStart + End, 0, 0, 0, 0 );
        for ( k = Beg; k < End; k++ )
        {
            pStart[k] = lit_neg(pStart[k]);
            pStart[k] -= 2 * pCnf->nVars;
        }
        Beg = End;
        if ( RetValue == l_False )
            continue;
//        printf( "Clause %d failed the inductive case.\n", i );
        CounterInd++;
    }
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    if ( CounterBase )
        printf( "Invariant verification: %d clauses (out of %d) FAILED the base case.\n", CounterBase, Vec_IntSize(vClauses) );
    if ( CounterInd )
        printf( "Invariant verification: %d clauses (out of %d) FAILED the inductive case.\n", CounterInd, Vec_IntSize(vClauses) );
    if ( CounterBase || CounterInd )
        return 0;
    printf( "Invariant verification: %d clauses verified correctly.  ", Vec_IntSize(vClauses) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    return 1;
}